

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_hash.c
# Opt level: O0

ion_err_t array_list_insert(int bucket_idx,ion_fpos_t bucket_loc,array_list_t *array_list)

{
  long lVar1;
  undefined1 *__src;
  int iVar2;
  ion_fpos_t *piVar3;
  long lVar4;
  undefined8 uStack_40;
  undefined1 auStack_38 [8];
  undefined1 *local_30;
  ion_byte_t *bucket_map_cache;
  array_list_t *paStack_20;
  int old_size;
  array_list_t *array_list_local;
  ion_fpos_t bucket_loc_local;
  int bucket_idx_local;
  
  paStack_20 = array_list;
  array_list_local = (array_list_t *)bucket_loc;
  bucket_loc_local._0_4_ = bucket_idx;
  if (array_list->current_size <= bucket_idx) {
    bucket_map_cache._4_4_ = array_list->current_size;
    array_list->current_size = array_list->current_size * 2;
    lVar1 = -((long)bucket_map_cache._4_4_ * 8 + 0xfU & 0xfffffffffffffff0);
    piVar3 = array_list->data;
    lVar4 = (long)bucket_map_cache._4_4_;
    local_30 = auStack_38 + lVar1;
    *(undefined8 *)((long)&uStack_40 + lVar1) = 0x113adb;
    memcpy(auStack_38 + lVar1,piVar3,lVar4 << 3);
    piVar3 = paStack_20->data;
    *(undefined8 *)((long)&uStack_40 + lVar1) = 0x113ae8;
    free(piVar3);
    paStack_20->data = (ion_fpos_t *)0x0;
    iVar2 = bucket_map_cache._4_4_ << 1;
    *(undefined8 *)((long)&uStack_40 + lVar1) = 0x113b05;
    piVar3 = (ion_fpos_t *)malloc((long)iVar2 << 3);
    paStack_20->data = piVar3;
    piVar3 = paStack_20->data;
    iVar2 = paStack_20->current_size;
    *(undefined8 *)((long)&uStack_40 + lVar1) = 0x113b2a;
    memset(piVar3,0,(long)iVar2 << 3);
    __src = local_30;
    piVar3 = paStack_20->data;
    lVar4 = (long)bucket_map_cache._4_4_;
    *(undefined8 *)((long)&uStack_40 + lVar1) = 0x113b43;
    memcpy(piVar3,__src,lVar4 << 3);
    if (paStack_20->data == (ion_fpos_t *)0x0) {
      piVar3 = paStack_20->data;
      *(undefined8 *)((long)&uStack_40 + lVar1) = 0x113b5c;
      free(piVar3);
      return '\x06';
    }
  }
  paStack_20->data[(int)bucket_loc_local] = (ion_fpos_t)array_list_local;
  return '\0';
}

Assistant:

ion_err_t
array_list_insert(
	int				bucket_idx,
	ion_fpos_t		bucket_loc,
	array_list_t	*array_list
) {
	/* case we need to expand array */
	if (bucket_idx >= array_list->current_size) {
		int old_size = array_list->current_size;

		array_list->current_size = array_list->current_size * 2;

		ion_byte_t *bucket_map_cache = alloca(old_size * sizeof(ion_fpos_t));

		memcpy(bucket_map_cache, array_list->data, old_size * sizeof(ion_fpos_t));
		free(array_list->data);
		array_list->data	= NULL;
		array_list->data	= malloc(2 * old_size * sizeof(ion_fpos_t));
		memset(array_list->data, 0, array_list->current_size * sizeof(ion_fpos_t));
		memcpy(array_list->data, bucket_map_cache, old_size * sizeof(ion_fpos_t));

		if (NULL == array_list->data) {
			free(array_list->data);
			return err_out_of_memory;
		}
	}

	array_list->data[bucket_idx] = bucket_loc;

	return err_ok;
}